

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int Jupiter::Socket::getLastError(void)

{
  int *piVar1;
  int lastError;
  
  piVar1 = __errno_location();
  return *piVar1;
}

Assistant:

int Jupiter::Socket::getLastError() { // static
#if defined _WIN32
	int lastError = WSAGetLastError();
#else // _WIN32
	int lastError = errno;
#endif // _WIN32
    return lastError;
}